

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::buildGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,
          _geometry_shader_input gs_input,_geometry_shader_output gs_output,
          uint n_primitives_to_emit_in_stream0,uint n_streams)

{
  uint uVar1;
  int iVar2;
  _geometry_shader_output _Var3;
  ostream *poVar4;
  _geometry_shader_input gs_input_00;
  _geometry_shader_output gs_output_00;
  long lVar5;
  uint n_stream;
  ulong uVar6;
  char *pcVar7;
  uint n_vertex;
  uint uVar8;
  string gs_output_string;
  string gs_input_string;
  stringstream gs_body_sstream;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  getGLSLStringForGSInput_abi_cxx11_
            (&local_1d8,(PipelineStatisticsQueryUtilities *)((ulong)this & 0xffffffff),gs_input_00);
  getGLSLStringForGSOutput_abi_cxx11_
            (&local_1f8,(PipelineStatisticsQueryUtilities *)(ulong)gs_input,gs_output_00);
  getNumberOfVerticesForGSOutput(gs_input);
  pcVar7 = "#version 150\n";
  if (n_primitives_to_emit_in_stream0 >= 2) {
    pcVar7 = "#version 400";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,pcVar7,(ulong)(n_primitives_to_emit_in_stream0 < 2) + 0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nlayout(",8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")                 in;\nlayout(",0x1d);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", max_vertices=",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") out;\n",7);
  if (1 < n_primitives_to_emit_in_stream0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    uVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(stream = ",0x10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") out vec4 out_stream",0x15);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      uVar6 = uVar6 + 1;
    } while (n_primitives_to_emit_in_stream0 != uVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nvoid main()\n{\n",0xf);
  uVar1 = getNumberOfVerticesForGSOutput(gs_input);
  if (n_primitives_to_emit_in_stream0 != 0) {
    iVar2 = -gs_output;
    uVar6 = 0;
    do {
      if ((int)uVar6 != iVar2) {
        _Var3 = GEOMETRY_SHADER_OUTPUT_FIRST;
        do {
          uVar8 = 0;
          do {
            while (std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n",
                              0x2c), n_primitives_to_emit_in_stream0 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"    EmitVertex();\n",0x12);
              uVar8 = uVar8 + 1;
              if (uVar8 == uVar1) {
                lVar5 = 0x14;
                pcVar7 = "    EndPrimitive();\n";
                poVar4 = (ostream *)local_1a8;
                goto LAB_00a440e3;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"    EmitStreamVertex(",0x15);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n",3);
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"    EndStreamPrimitive(",0x17);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          lVar5 = 3;
          pcVar7 = ");\n";
LAB_00a440e3:
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar5);
          _Var3 = _Var3 + GEOMETRY_SHADER_OUTPUT_LINE_STRIP;
        } while (_Var3 != gs_output);
      }
      uVar6 = uVar6 + 1;
      gs_output = gs_output + GEOMETRY_SHADER_OUTPUT_LINE_STRIP;
    } while (uVar6 != n_primitives_to_emit_in_stream0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::buildGeometryShaderBody(_geometry_shader_input  gs_input,
																	  _geometry_shader_output gs_output,
																	  unsigned int n_primitives_to_emit_in_stream0,
																	  unsigned int n_streams)
{
	DE_ASSERT(n_primitives_to_emit_in_stream0 >= 1);
	DE_ASSERT(n_streams >= 1);

	/* Each stream will output (n+1) primitives, where n corresponds to the number of primitives emitted
	 * by the previous stream. Stream 0 emits user-defined number of primitievs.
	 */
	std::stringstream gs_body_sstream;
	const std::string gs_input_string  = getGLSLStringForGSInput(gs_input);
	const std::string gs_output_string = getGLSLStringForGSOutput(gs_output);
	unsigned int	  n_max_vertices   = 0;
	unsigned int	  n_vertices_required_for_gs_output =
		PipelineStatisticsQueryUtilities::getNumberOfVerticesForGSOutput(gs_output);

	for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
	{
		n_max_vertices += n_vertices_required_for_gs_output * (n_primitives_to_emit_in_stream0 + n_stream);
	} /* for (all streams) */

	/* Form the preamble. Note that we need to use the right ES SL version,
	 * since vertex streams are not a core GL3.2 feature.
	 **/
	gs_body_sstream << ((n_streams > 1) ? "#version 400" : "#version 150\n") << "\n"
																				"layout("
					<< gs_input_string << ")                 in;\n"
										  "layout("
					<< gs_output_string << ", max_vertices=" << n_max_vertices << ") out;\n";

	/* If we need to define multiple streams, do it now */
	if (n_streams > 1)
	{
		gs_body_sstream << "\n";

		for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
		{
			gs_body_sstream << "layout(stream = " << n_stream << ") out vec4 out_stream" << n_stream << ";\n";
		} /* for (all streams) */
	}	 /* if (n_streams > 1) */

	/* Contine forming actual body */
	gs_body_sstream << "\n"
					   "void main()\n"
					   "{\n";

	/* Emit primitives */
	const unsigned int n_output_primitive_vertices =
		PipelineStatisticsQueryUtilities::getNumberOfVerticesForGSOutput(gs_output);

	for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
	{
		const unsigned int n_primitives_to_emit = n_primitives_to_emit_in_stream0 + n_stream;

		for (unsigned int n_primitive = 0; n_primitive < n_primitives_to_emit; ++n_primitive)
		{
			for (unsigned int n_vertex = 0; n_vertex < n_output_primitive_vertices; ++n_vertex)
			{
				gs_body_sstream << "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n";

				if (n_streams == 1)
				{
					gs_body_sstream << "    EmitVertex();\n";
				}
				else
				{
					gs_body_sstream << "    EmitStreamVertex(" << n_stream << ");\n";
				}
			}

			if (n_streams == 1)
			{
				gs_body_sstream << "    EndPrimitive();\n";
			}
			else
			{
				gs_body_sstream << "    EndStreamPrimitive(" << n_stream << ");\n";
			}
		} /* for (all primitives the caller wants the shader to emit) */
	}	 /* for (all streams) */

	gs_body_sstream << "}\n";

	return gs_body_sstream.str();
}